

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

ParseError *
jaegertracing::net::http::ParseError::make
          (ParseError *__return_storage_ptr__,string *expected,string *actual)

{
  ostream *poVar1;
  string sStack_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Parse error, expected ");
  poVar1 = std::operator<<(poVar1,(string *)expected);
  poVar1 = std::operator<<(poVar1,", encountered \"");
  poVar1 = std::operator<<(poVar1,(string *)actual);
  std::operator<<(poVar1,'\"');
  std::__cxx11::stringbuf::str();
  invalid_argument(__return_storage_ptr__,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

static ParseError make(const std::string& expected,
                           const std::string& actual)
    {
        std::ostringstream oss;
        oss << "Parse error, expected " << expected << ", encountered \""
            << actual << '"';
        return ParseError(oss.str());
    }